

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O0

void EmitUncompressedMetaBlock
               (uint8_t *begin,uint8_t *end,size_t storage_ix_start,size_t *storage_ix,
               uint8_t *storage)

{
  size_t len_00;
  size_t len;
  uint8_t *storage_local;
  size_t *storage_ix_local;
  size_t storage_ix_start_local;
  uint8_t *end_local;
  uint8_t *begin_local;
  
  len_00 = (long)end - (long)begin;
  RewindBitPosition(storage_ix_start,storage_ix,storage);
  BrotliStoreMetaBlockHeader(len_00,1,storage_ix,storage);
  *storage_ix = *storage_ix + 7 & 0xfffffff8;
  memcpy(storage + (*storage_ix >> 3),begin,len_00);
  *storage_ix = len_00 * 8 + *storage_ix;
  storage[*storage_ix >> 3] = '\0';
  return;
}

Assistant:

static void EmitUncompressedMetaBlock(const uint8_t* begin, const uint8_t* end,
                                      const size_t storage_ix_start,
                                      size_t* storage_ix, uint8_t* storage) {
  const size_t len = (size_t)(end - begin);
  RewindBitPosition(storage_ix_start, storage_ix, storage);
  BrotliStoreMetaBlockHeader(len, 1, storage_ix, storage);
  *storage_ix = (*storage_ix + 7u) & ~7u;
  memcpy(&storage[*storage_ix >> 3], begin, len);
  *storage_ix += len << 3;
  storage[*storage_ix >> 3] = 0;
}